

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool perfetto::internal::TrackEventInternal::IsCategoryEnabled
               (TrackEventCategoryRegistry *registry,TrackEventConfig *config,Category *category)

{
  string *psVar1;
  MatchType MVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  char cVar7;
  int iVar8;
  code *extraout_RAX;
  code *pcVar9;
  size_t __n;
  long lVar10;
  long lVar11;
  int iVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pattern;
  ulong uVar13;
  ulong uVar14;
  string *psVar15;
  Category *pCVar16;
  value_type match_type;
  array<perfetto::internal::(anonymous_namespace)::MatchType,_2UL> match_types;
  allocator<char> local_109;
  ulong local_108;
  MatchType local_fc;
  Category *local_f8;
  TrackEventConfig *local_f0;
  char *local_e8;
  undefined1 local_e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0 [2];
  TrackEventConfig *local_a8;
  MatchType *pMStack_a0;
  code *local_98;
  code *pcStack_90;
  TrackEventConfig *local_88;
  MatchType *pMStack_80;
  code *local_78;
  code *pcStack_70;
  ulong local_60;
  long *local_58 [2];
  long local_48 [2];
  ulong local_38;
  
  local_f8 = category;
  local_f0 = config;
  if ((category->name_sizes_)._M_elems[1] == '\0') {
    local_58[0] = (long *)0x100000000;
    lVar10 = 0;
    local_108 = 0x100000000;
    do {
      local_fc = *(MatchType *)((long)local_58 + lVar10);
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_e0,local_f8->name,&local_109);
      MVar2 = local_fc;
      psVar15 = (local_f0->enabled_categories_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar1 = (local_f0->enabled_categories_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      while ((bVar3 = psVar15 != psVar1, bVar3 &&
             (bVar4 = anon_unknown_17::NameMatchesPattern(psVar15,(string *)local_e0,MVar2), !bVar4)
             )) {
        psVar15 = psVar15 + 1;
      }
      pcVar9 = (code *)(local_e0 + 0x10);
      if ((code *)local_e0._0_8_ != pcVar9) {
        operator_delete((void *)local_e0._0_8_,(ulong)(local_d0[0]._M_allocated_capacity + 1));
        pcVar9 = extraout_RAX;
      }
      if (bVar3) {
LAB_002cb061:
        local_108 = CONCAT71((int7)((ulong)pcVar9 >> 8),1);
LAB_002cb068:
        bVar5 = 0;
      }
      else {
        local_88 = local_f0;
        pMStack_80 = &local_fc;
        pcStack_70 = std::
                     _Function_handler<bool_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:45319:26)>
                     ::_M_invoke;
        local_78 = std::
                   _Function_handler<bool_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:45319:26)>
                   ::_M_manager;
        lVar11 = 0x10;
        do {
          pcVar9 = *(code **)((long)(local_f8->tags)._M_elems + lVar11 + -0x10);
          if (pcVar9 == (code *)0x0) {
            bVar5 = 2;
            bVar6 = 0;
          }
          else {
            local_e0._0_8_ = pcVar9;
            if (local_78 == (code *)0x0) goto LAB_002cb220;
            bVar5 = (*pcStack_70)(&local_88,(string *)local_e0);
            bVar6 = bVar5 ^ 1;
          }
          if (bVar6 == 0) goto LAB_002caff1;
          lVar11 = lVar11 + 8;
        } while (lVar11 != 0x30);
        bVar5 = 2;
LAB_002caff1:
        bVar3 = true;
        if (bVar5 == 2) {
          iVar12 = strncmp(local_f8->name,"disabled-by-default-",0x14);
          if (iVar12 == 0) {
            local_e0._0_8_ = &(anonymous_namespace)::kSlowTag;
            if (local_78 == (code *)0x0) {
LAB_002cb220:
              ::std::__throw_bad_function_call();
            }
            cVar7 = (*pcStack_70)(&local_88,(string *)local_e0);
            if (cVar7 != '\0') goto LAB_002cb043;
          }
          bVar3 = false;
        }
LAB_002cb043:
        pcVar9 = local_78;
        if (local_78 != (code *)0x0) {
          pcVar9 = (code *)(*local_78)(&local_88,&local_88,3);
        }
        if (bVar3) goto LAB_002cb061;
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_e0,local_f8->name,&local_109);
        MVar2 = local_fc;
        psVar15 = (local_f0->disabled_categories_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar1 = (local_f0->disabled_categories_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        while ((bVar3 = psVar15 != psVar1, bVar3 &&
               (bVar4 = anon_unknown_17::NameMatchesPattern(psVar15,(string *)local_e0,MVar2),
               !bVar4))) {
          psVar15 = psVar15 + 1;
        }
        if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
          operator_delete((void *)local_e0._0_8_,(ulong)(local_d0[0]._M_allocated_capacity + 1));
        }
        if (bVar3) {
          local_108 = 0;
          goto LAB_002cb068;
        }
        local_a8 = local_f0;
        pMStack_a0 = &local_fc;
        pcStack_90 = std::
                     _Function_handler<bool_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:45332:26)>
                     ::_M_invoke;
        local_98 = std::
                   _Function_handler<bool_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:45332:26)>
                   ::_M_manager;
        lVar11 = 0x10;
        do {
          pcVar9 = *(code **)((long)(local_f8->tags)._M_elems + lVar11 + -0x10);
          if (pcVar9 == (code *)0x0) {
            bVar5 = 2;
            bVar6 = 0;
          }
          else {
            local_e0._0_8_ = pcVar9;
            if (local_98 == (code *)0x0) goto LAB_002cb225;
            bVar5 = (*pcStack_90)(&local_a8,(string *)local_e0);
            bVar6 = bVar5 ^ 1;
          }
          if (bVar6 == 0) goto LAB_002cb19a;
          lVar11 = lVar11 + 8;
        } while (lVar11 != 0x30);
        bVar5 = 2;
LAB_002cb19a:
        if (bVar5 == 2) {
          iVar12 = strncmp(local_f8->name,"disabled-by-default-",0x14);
          if (iVar12 == 0) {
            local_e0._0_8_ = &(anonymous_namespace)::kSlowTag;
            if (local_98 == (code *)0x0) {
LAB_002cb225:
              ::std::__throw_bad_function_call();
            }
            cVar7 = (*pcStack_90)(&local_a8,(string *)local_e0);
            if (cVar7 != '\0') goto LAB_002cb1e6;
          }
          bVar5 = 1;
        }
        else {
LAB_002cb1e6:
          bVar5 = 0;
        }
        if (local_98 != (code *)0x0) {
          (*local_98)(&local_a8,&local_a8,3);
        }
        local_108 = CONCAT71((int7)(local_108 >> 8),(byte)local_108 & bVar5);
      }
      if (bVar5 == 0) goto LAB_002cae95;
      lVar10 = lVar10 + 4;
    } while (lVar10 != 8);
    bVar5 = 1;
  }
  else {
    local_e8 = category->name;
    local_108 = 0;
    uVar14 = 0;
    do {
      if (uVar14 < 4) {
        __n = (size_t)(category->name_sizes_)._M_elems[uVar14];
      }
      else {
        __n = 0;
      }
      if (__n == 0) {
LAB_002cae88:
        bVar3 = false;
      }
      else {
        if (registry->category_count_ == 0) {
          bVar3 = true;
        }
        else {
          lVar10 = 0;
          uVar13 = 0;
          local_60 = __n;
          local_38 = uVar14;
          do {
            pCVar16 = registry->categories_;
            iVar12 = 4;
            bVar3 = true;
            if (((pCVar16->name_sizes_)._M_elems[lVar10 + 1] == '\0') &&
               ((uint)__n == (uint)(pCVar16->name_sizes_)._M_elems[lVar10])) {
              pCVar16 = (Category *)((long)(pCVar16->tags)._M_elems + lVar10 + -0x10);
              iVar8 = strncmp(pCVar16->name,local_e8,__n);
              __n = local_60;
              if (iVar8 == 0) {
                bVar3 = IsCategoryEnabled(registry,local_f0,pCVar16);
                local_108 = local_108 & 0xff;
                if (bVar3) {
                  local_108 = 1;
                }
                iVar12 = 2 - (uint)bVar3;
                bVar3 = false;
                __n = local_60;
              }
            }
            if (!bVar3) goto LAB_002cad7c;
            uVar13 = uVar13 + 1;
            lVar10 = lVar10 + 0x38;
          } while (uVar13 < registry->category_count_);
          iVar12 = 2;
LAB_002cad7c:
          bVar3 = iVar12 == 2;
          category = local_f8;
          uVar14 = local_38;
        }
        if (bVar3) {
          local_e0._0_8_ = local_e0 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_e0,local_e8,local_e8 + __n);
          local_58[0] = local_48;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_58,local_e0._0_8_,(char *)(local_e0._8_8_ + local_e0._0_8_));
          if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
            operator_delete((void *)local_e0._0_8_,(ulong)(local_d0[0]._M_allocated_capacity + 1));
          }
          Category::FromDynamicCategory((Category *)local_e0,(char *)local_58[0]);
          bVar3 = IsCategoryEnabled(registry,local_f0,(Category *)local_e0);
          local_108 = local_108 & 0xff;
          if (bVar3) {
            local_108 = 1;
          }
          if (local_58[0] != local_48) {
            operator_delete(local_58[0],local_48[0] + 1);
          }
          bVar3 = !bVar3;
        }
        else {
          bVar3 = false;
        }
        if (!bVar3) goto LAB_002cae88;
        local_e8 = local_e8 + __n + 1;
        bVar3 = true;
      }
      uVar14 = uVar14 + 1;
    } while (bVar3);
LAB_002cae95:
    bVar5 = (byte)local_108;
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool TrackEventInternal::IsCategoryEnabled(
    const TrackEventCategoryRegistry& registry,
    const protos::gen::TrackEventConfig& config,
    const Category& category) {
  // If this is a group category, check if any of its constituent categories are
  // enabled. If so, then this one is enabled too.
  if (category.IsGroup()) {
    bool result = false;
    category.ForEachGroupMember([&](const char* member_name, size_t name_size) {
      for (size_t i = 0; i < registry.category_count(); i++) {
        const auto ref_category = registry.GetCategory(i);
        // Groups can't refer to other groups.
        if (ref_category->IsGroup())
          continue;
        // Require an exact match.
        if (ref_category->name_size() != name_size ||
            strncmp(ref_category->name, member_name, name_size)) {
          continue;
        }
        if (IsCategoryEnabled(registry, config, *ref_category)) {
          result = true;
          // Break ForEachGroupMember() loop.
          return false;
        }
        break;
      }
      // No match? Must be a dynamic category.
      DynamicCategory dyn_category(std::string(member_name, name_size));
      Category ref_category{Category::FromDynamicCategory(dyn_category)};
      if (IsCategoryEnabled(registry, config, ref_category)) {
        result = true;
        // Break ForEachGroupMember() loop.
        return false;
      }
      // No match found => keep iterating.
      return true;
    });
    return result;
  }

  auto has_matching_tag = [&](std::function<bool(const char*)> matcher) {
    for (const auto& tag : category.tags) {
      if (!tag)
        break;
      if (matcher(tag))
        return true;
    }
    // Legacy "disabled-by-default" categories automatically get the "slow" tag.
    if (!strncmp(category.name, kLegacySlowPrefix, strlen(kLegacySlowPrefix)) &&
        matcher(kSlowTag)) {
      return true;
    }
    return false;
  };

  // First try exact matches, then pattern matches.
  const std::array<MatchType, 2> match_types = {
      {MatchType::kExact, MatchType::kPattern}};
  for (auto match_type : match_types) {
    // 1. Enabled categories.
    if (NameMatchesPatternList(config.enabled_categories(), category.name,
                               match_type)) {
      return true;
    }

    // 2. Enabled tags.
    if (has_matching_tag([&](const char* tag) {
          return NameMatchesPatternList(config.enabled_tags(), tag, match_type);
        })) {
      return true;
    }

    // 3. Disabled categories.
    if (NameMatchesPatternList(config.disabled_categories(), category.name,
                               match_type)) {
      return false;
    }

    // 4. Disabled tags.
    if (has_matching_tag([&](const char* tag) {
          if (config.disabled_tags_size()) {
            return NameMatchesPatternList(config.disabled_tags(), tag,
                                          match_type);
          } else {
            // The "slow" and "debug" tags are disabled by default.
            return NameMatchesPattern(kSlowTag, tag, match_type) ||
                   NameMatchesPattern(kDebugTag, tag, match_type);
          }
        })) {
      return false;
    }
  }

  // If nothing matched, enable the category by default.
  return true;
}